

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_opt_start(lua_State *L)

{
  GCstr *__s1;
  size_t *psVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  GCstr *pGVar5;
  uint uVar6;
  global_State *g;
  GCstr *__s1_00;
  long lVar7;
  int narg;
  size_t __n;
  ulong __n_00;
  char *pcVar8;
  bool bVar9;
  
  g = (global_State *)(ulong)(L->glref).ptr32;
  iVar3 = (int)((ulong)((long)L->top - (long)L->base) >> 3);
  if (iVar3 == 0) {
    *(uint *)&g[1].gc.freed = (uint)g[1].gc.freed & 0xf000ffff | 0x3ff0000;
  }
  else if (0 < iVar3) {
    narg = 1;
    do {
      pGVar5 = lj_lib_checkstr(L,narg);
      cVar2 = (char)pGVar5[1].nextgc.gcptr32;
      if (((byte)(cVar2 - 0x30U) < 10) && (*(char *)((long)&pGVar5[1].nextgc.gcptr32 + 1) == '\0'))
      {
        uVar6 = 0x3ff0000;
        if ((byte)(cVar2 - 0x30U) < 3) {
          uVar6 = *(uint *)(&DAT_0015fc3c + (ulong)(byte)(cVar2 - 0x30U) * 4);
        }
        *(uint *)&g[1].gc.freed = (uint)g[1].gc.freed & 0xf000ffff | uVar6;
      }
      else {
        __s1 = pGVar5 + 1;
        if (cVar2 == 'n') {
          if (*(char *)((long)&pGVar5[1].nextgc.gcptr32 + 1) == 'o') {
            __s1_00 = (GCstr *)((long)&(__s1->nextgc).gcptr32 +
                               (ulong)(*(char *)((long)&pGVar5[1].nextgc.gcptr32 + 2) == '-') + 2);
            goto LAB_0012024e;
          }
LAB_00120256:
          bVar9 = false;
          __s1_00 = __s1;
        }
        else if (cVar2 == '-') {
          __s1_00 = (GCstr *)((long)&pGVar5[1].nextgc.gcptr32 + 1);
LAB_0012024e:
          bVar9 = true;
        }
        else {
          if (cVar2 != '+') goto LAB_00120256;
          bVar9 = false;
          __s1_00 = (GCstr *)((long)&pGVar5[1].nextgc.gcptr32 + 1);
        }
        uVar6 = 0x10000;
        __n = 4;
        pcVar8 = 
        "\x04fold\x03cse\x03dce\x03fwd\x03dse\x06narrow\x04loop\x03abc\x04sink\x04fuse\x03fma";
        do {
          iVar4 = strncmp((char *)__s1_00,(char *)((byte *)pcVar8 + 1),__n);
          if ((iVar4 == 0) && (*(char *)((long)&(__s1_00->nextgc).gcptr32 + __n) == '\0')) {
            if (bVar9) {
              psVar1 = &g[1].gc.freed;
              *(uint *)psVar1 = (uint)*psVar1 & ~uVar6;
            }
            else {
              psVar1 = &g[1].gc.freed;
              *(uint *)psVar1 = (uint)*psVar1 | uVar6;
            }
            goto LAB_00120394;
          }
          pcVar8 = (char *)((byte *)pcVar8 + __n + 1);
          uVar6 = uVar6 * 2;
          __n = (size_t)(byte)*pcVar8;
        } while (__n != 0);
        lVar7 = 0x223;
        pcVar8 = 
        "\bmaxtrace\tmaxrecord\nmaxirconst\amaxside\amaxsnap\tminstitch\ahotloop\ahotexit\atryside\ninstunroll\nloopunroll\ncallunroll\trecunroll\tsizemcode\bmaxmcode"
        ;
        while( true ) {
          __n_00 = (ulong)(byte)*pcVar8;
          iVar4 = strncmp((char *)__s1,(char *)((byte *)pcVar8 + 1),__n_00);
          if ((iVar4 == 0) && (*(char *)((long)&(__s1->nextgc).gcptr32 + __n_00) == '=')) break;
          pcVar8 = (char *)((byte *)pcVar8 + __n_00 + 1);
          lVar7 = lVar7 + 1;
          if ((int)lVar7 == 0x232) goto LAB_001203cf;
        }
        cVar2 = *(char *)((long)&pGVar5[1].nextgc.gcptr32 + __n_00 + 1);
        iVar4 = 0;
        if ((byte)(cVar2 - 0x30U) < 10) {
          pcVar8 = (char *)((long)&pGVar5[1].nextgc.gcptr32 + __n_00 + 2);
          iVar4 = 0;
          do {
            iVar4 = (uint)(byte)(cVar2 - 0x30) + iVar4 * 10;
            cVar2 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while ((byte)(cVar2 - 0x30U) < 10);
        }
        if (cVar2 != '\0') {
LAB_001203cf:
          lj_err_callerv(L,LJ_ERR_JITOPT,__s1);
        }
        *(int *)((long)(g->strbloom).cur + lVar7 * 4 + -0x10) = iVar4;
        if ((int)lVar7 == 0x229) {
          lj_dispatch_init_hotcount(g);
        }
      }
LAB_00120394:
      bVar9 = narg != iVar3;
      narg = narg + 1;
    } while (bVar9);
  }
  return 0;
}

Assistant:

LJLIB_CF(jit_opt_start)
{
  jit_State *J = L2J(L);
  int nargs = (int)(L->top - L->base);
  if (nargs == 0) {
    J->flags = (J->flags & ~JIT_F_OPT_MASK) | JIT_F_OPT_DEFAULT;
  } else {
    int i;
    for (i = 1; i <= nargs; i++) {
      const char *str = strdata(lj_lib_checkstr(L, i));
      if (!jitopt_level(J, str) &&
	  !jitopt_flag(J, str) &&
	  !jitopt_param(J, str))
	lj_err_callerv(L, LJ_ERR_JITOPT, str);
    }
  }
  return 0;
}